

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utImporter.cpp
# Opt level: O0

bool __thiscall TestPlugin::CanRead(TestPlugin *this,string *pFile,IOSystem *param_2,bool param_3)

{
  bool bVar1;
  bool local_71;
  undefined1 local_58 [8];
  string extension;
  size_type pos;
  bool param_3_local;
  IOSystem *param_2_local;
  string *pFile_local;
  TestPlugin *this_local;
  
  extension.field_2._8_8_ = std::__cxx11::string::find_last_of((char)pFile,0x2e);
  if (extension.field_2._8_8_ == -1) {
    this_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::substr((ulong)local_58,(ulong)pFile);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58,".apple");
    local_71 = true;
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,".mac");
      local_71 = true;
      if (!bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_58,".linux");
        local_71 = true;
        if (!bVar1) {
          local_71 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_58,".windows");
        }
      }
    }
    this_local._7_1_ = local_71;
    std::__cxx11::string::~string((string *)local_58);
  }
  return this_local._7_1_;
}

Assistant:

virtual bool CanRead(
        const std::string& pFile, IOSystem* /*pIOHandler*/, bool /*test*/) const
    {
        std::string::size_type pos = pFile.find_last_of('.');
        // no file extension - can't read
        if( pos == std::string::npos)
            return false;
        std::string extension = pFile.substr( pos);

        // todo ... make case-insensitive
        return (extension == ".apple" || extension == ".mac" ||
            extension == ".linux" || extension == ".windows" );

    }